

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O2

VkPipelineDepthStencilStateCreateInfo * __thiscall
Fossilize::StateRecorder::Impl::copy<VkPipelineDepthStencilStateCreateInfo>
          (Impl *this,VkPipelineDepthStencilStateCreateInfo *src,size_t count,
          ScratchAllocator *alloc)

{
  VkPipelineDepthStencilStateCreateInfo *pVVar1;
  
  if (count != 0) {
    pVVar1 = ScratchAllocator::allocate_n<VkPipelineDepthStencilStateCreateInfo>(alloc,count);
    if (pVVar1 != (VkPipelineDepthStencilStateCreateInfo *)0x0) {
      pVVar1 = (VkPipelineDepthStencilStateCreateInfo *)memmove(pVVar1,src,count * 0x68);
      return pVVar1;
    }
  }
  return (VkPipelineDepthStencilStateCreateInfo *)0x0;
}

Assistant:

T *StateRecorder::Impl::copy(const T *src, size_t count, ScratchAllocator &alloc)
{
	if (!count)
		return nullptr;

	auto *new_data = alloc.allocate_n<T>(count);
	if (new_data)
		std::copy(src, src + count, new_data);
	return new_data;
}